

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# armci.c
# Opt level: O0

int PARMCI_PutS(void *src_ptr,int *src_stride_arr,void *dst_ptr,int *dst_stride_arr,int *count,
               int stride_levels,int proc)

{
  int iVar1;
  int *in_RCX;
  int *in_RSI;
  int *in_R8;
  int in_R9D;
  int lcount;
  int i;
  int iret;
  int in_stack_0000005c;
  int *in_stack_00000060;
  int *in_stack_00000068;
  void *in_stack_00000070;
  int *in_stack_00000078;
  void *in_stack_00000080;
  int in_stack_00000090;
  comex_group_t in_stack_00000098;
  comex_group_t in_stack_ffffffffffffffbc;
  int in_stack_ffffffffffffffc0;
  int in_stack_ffffffffffffffc4;
  int iVar2;
  undefined4 in_stack_ffffffffffffffd0;
  
  iVar1 = armci_check_contiguous(in_RSI,in_RCX,in_R8,in_R9D);
  if (iVar1 == 0) {
    iVar1 = comex_puts(in_stack_00000080,in_stack_00000078,in_stack_00000070,in_stack_00000068,
                       in_stack_00000060,in_stack_0000005c,in_stack_00000090,in_stack_00000098);
  }
  else {
    iVar1 = 1;
    for (iVar2 = 0; iVar2 <= in_R9D; iVar2 = iVar2 + 1) {
      iVar1 = in_R8[iVar2] * iVar1;
    }
    iVar1 = comex_put((void *)CONCAT44(in_R9D,in_stack_ffffffffffffffd0),
                      (void *)CONCAT44(iVar2,iVar1),in_stack_ffffffffffffffc4,
                      in_stack_ffffffffffffffc0,in_stack_ffffffffffffffbc);
  }
  return iVar1;
}

Assistant:

int PARMCI_PutS(void *src_ptr, int *src_stride_arr, void *dst_ptr, int *dst_stride_arr, int *count, int stride_levels, int proc)
{
  int iret;
  /* check if data is contiguous */
  if (armci_check_contiguous(src_stride_arr, dst_stride_arr, count, stride_levels)) {
    int i;
    int lcount = 1;
    for (i=0; i<=stride_levels; i++) lcount *= count[i];
    iret = comex_put(src_ptr, dst_ptr, lcount, proc, COMEX_GROUP_WORLD);
  } else {
    iret = comex_puts(src_ptr, src_stride_arr, dst_ptr, dst_stride_arr,
        count, stride_levels, proc, COMEX_GROUP_WORLD);
  }
  return iret;
}